

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TuningsImpl.h
# Opt level: O3

istream * Tunings::getlineEndingIndependent(istream *is,string *t)

{
  long *plVar1;
  byte *pbVar2;
  uint uVar3;
  sentry se;
  sentry local_19;
  
  t->_M_string_length = 0;
  *(t->_M_dataplus)._M_p = '\0';
  std::istream::sentry::sentry(&local_19,is,true);
  if (local_19 == (sentry)0x1) {
    plVar1 = *(long **)(is + *(long *)(*(long *)is + -0x18) + 0xe8);
    while( true ) {
      pbVar2 = (byte *)plVar1[2];
      if (pbVar2 < (byte *)plVar1[3]) {
        uVar3 = (uint)*pbVar2;
        plVar1[2] = (long)(pbVar2 + 1);
      }
      else {
        uVar3 = (**(code **)(*plVar1 + 0x50))(plVar1);
      }
      if (uVar3 == 0xffffffff) {
        std::ios::clear((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
        if (t->_M_string_length != 0) {
          return is;
        }
        std::ios::clear((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
        return is;
      }
      if (uVar3 == 10) {
        return is;
      }
      if (uVar3 == 0xd) break;
      std::__cxx11::string::push_back((char)t);
    }
    if ((byte *)plVar1[2] < (byte *)plVar1[3]) {
      uVar3 = (uint)*(byte *)plVar1[2];
    }
    else {
      uVar3 = (**(code **)(*plVar1 + 0x48))(plVar1);
    }
    if (uVar3 == 10) {
      if ((ulong)plVar1[2] < (ulong)plVar1[3]) {
        plVar1[2] = plVar1[2] + 1;
      }
      else {
        (**(code **)(*plVar1 + 0x50))(plVar1);
      }
    }
  }
  return is;
}

Assistant:

inline std::istream &getlineEndingIndependent(std::istream &is, std::string &t)
{
    t.clear();

    std::istream::sentry se(is, true);
    if (!se)
        return is;

    std::streambuf *sb = is.rdbuf();

    for (;;)
    {
        int c = sb->sbumpc();
        switch (c)
        {
        case '\n':
            return is;
        case '\r':
            if (sb->sgetc() == '\n')
            {
                sb->sbumpc();
            }
            return is;
        case EOF:
            is.setstate(std::ios::eofbit);
            if (t.empty())
            {
                is.setstate(std::ios::badbit);
            }
            return is;
        default:
            t += (char)c;
        }
    }
}